

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O3

int gen_enum_parser(fb_output_t *out,fb_compound_type_t *ct)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int n;
  fb_scoped_name_t snt;
  int local_13c;
  trie_t local_138;
  fb_scoped_name_t local_108;
  
  local_13c = 0;
  local_138.type = 0;
  local_138.union_total = 0;
  local_138.label = 0;
  local_138._44_4_ = 0;
  uVar1 = (ct->symbol).kind;
  if (1 < (ushort)(uVar1 - 3)) {
    __assert_fail("ct->symbol.kind == fb_is_enum || ct->symbol.kind == fb_is_union",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                  ,0x513,"int gen_enum_parser(fb_output_t *, fb_compound_type_t *)");
  }
  local_138.dict = build_compound_dict(ct,&local_13c);
  iVar3 = local_13c;
  if (local_13c < 1 || local_138.dict != (dict_entry_t *)0x0) {
    local_138.type = 2;
    local_138.gen_match = gen_enum_match;
    local_138.gen_unmatched = gen_enum_unmatched;
    local_138.ct = ct;
    memset(&local_108,0,0xe8);
    __flatcc_fb_scoped_symbol_name(ct->scope,&ct->symbol,&local_108);
    println(out,
            "static const char *%s_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
            ,&local_108);
    out->indent = out->indent + 2;
    println(out,"int *value_sign, uint64_t *value, int *aggregate)");
    iVar2 = out->indent;
    if (iVar2 != 0) {
      out->indent = iVar2 + -1;
      if (iVar2 + -1 != 0) {
        out->indent = iVar2 + -2;
        println(out,"{");
        out->indent = out->indent + 1;
        if (iVar3 == 0) {
          println(out,"/* Enum has no fields. */");
          println(out,"*aggregate = 0;");
          println(out,"return buf; /* unmatched; */");
          iVar3 = out->indent;
          if (iVar3 == 0) goto LAB_00113541;
        }
        else {
          println(out,"const char *unmatched = buf;");
          println(out,"const char *mark;");
          println(out,"uint64_t w;");
          println(out,"");
          println(out,"w = flatcc_json_parser_symbol_part(buf, end);");
          gen_trie(out,&local_138,0,iVar3 + -1,0);
          println(out,"return buf;");
          iVar3 = out->indent;
          if (iVar3 == 0) {
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x533,"int gen_enum_parser(fb_output_t *, fb_compound_type_t *)");
          }
        }
        out->indent = iVar3 + -1;
        println(out,"}");
        println(out,"");
        iVar3 = extraout_EAX;
        if (local_138.dict != (dict_entry_t *)0x0) {
          free(local_138.dict);
          iVar3 = extraout_EAX_00;
        }
        return iVar3;
      }
    }
    __assert_fail("out->indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                  ,0x524,"int gen_enum_parser(fb_output_t *, fb_compound_type_t *)");
  }
  gen_enum_parser_cold_1();
LAB_00113541:
  __assert_fail("out->indent",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                ,0x52a,"int gen_enum_parser(fb_output_t *, fb_compound_type_t *)");
}

Assistant:

static int gen_enum_parser(fb_output_t *out, fb_compound_type_t *ct)
{
    fb_scoped_name_t snt;
    int n = 0;
    trie_t trie;

    fb_clear(trie);
    assert(ct->symbol.kind == fb_is_enum || ct->symbol.kind == fb_is_union);

    if ((trie.dict = build_compound_dict(ct, &n)) == 0 && n > 0) {
        gen_panic(out, "internal error: could not build dictionary for json parser\n");
        return -1;
    }
    trie.ct = ct;
    trie.type = enum_trie;
    trie.gen_match = gen_enum_match;
    trie.gen_unmatched = gen_enum_unmatched;

    fb_clear(snt);
    fb_compound_name(ct, &snt);

    println(out, "static const char *%s_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,", snt.text);
    indent(); indent();
    println(out, "int *value_sign, uint64_t *value, int *aggregate)");
    unindent(); unindent();
    println(out, "{"); indent();
    if (n == 0) {
        println(out, "/* Enum has no fields. */");
        println(out, "*aggregate = 0;");
        println(out, "return buf; /* unmatched; */");
        unindent(); println(out, "}");
    } else {
        println(out, "const char *unmatched = buf;");
        println(out, "const char *mark;");
        println(out, "uint64_t w;");
        println(out, "");
        println(out, "w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(out, &trie, 0, n - 1, 0);
        println(out, "return buf;");
        unindent(); println(out, "}");
    }
    println(out, "");
    clear_dict(trie.dict);
    return 0;
}